

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O3

bool __thiscall
ON_3dmAnnotationSettings::Write(ON_3dmAnnotationSettings *this,ON_BinaryArchive *file)

{
  ON_3dmAnnotationSettingsPrivate *pOVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  ON_UUID local_38;
  
  iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
  bVar2 = ON_BinaryArchive::Write3dmChunkVersion(file,1,(uint)(0x3b < iVar3) * 2 + 2);
  if (((((((bVar2) && (bVar2 = ON_BinaryArchive::WriteDouble(file,1.0), bVar2)) &&
         (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_textheight), bVar2)) &&
        ((bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_dimexe), bVar2 &&
         (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_dimexo), bVar2)))) &&
       ((bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_arrowlength), bVar2 &&
        ((bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_arrowwidth), bVar2 &&
         (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_centermark), bVar2)))))) &&
      (bVar2 = ON_BinaryArchive::WriteInt(file,(uint)this->m_dimunits), bVar2)) &&
     (((bVar2 = ON_BinaryArchive::WriteInt(file,this->m_arrowtype), bVar2 &&
       (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_angularunits), bVar2)) &&
      (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_lengthformat), bVar2)))) {
    bVar2 = ON_BinaryArchive::WriteInt(file,this->m_angleformat);
    iVar4 = ON_BinaryArchive::Archive3dmVersion(file);
    if (((!bVar2) || (bVar2 = ON_BinaryArchive::WriteInt(file,(uint)(2 < iVar4) * 2), !bVar2)) ||
       (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_resolution), !bVar2)) goto LAB_00375d0e;
    bVar2 = ON_BinaryArchive::WriteString(file,&this->m_facename);
  }
  else {
    ON_BinaryArchive::Archive3dmVersion(file);
LAB_00375d0e:
    bVar2 = false;
  }
  fVar5 = Default3dmAnnotationSettingsPrivate.m_world_view_text_scale;
  if ((this != &Default) && (this->m_private != (ON_3dmAnnotationSettingsPrivate *)0x0)) {
    fVar5 = this->m_private->m_world_view_text_scale;
  }
  if ((bVar2 == false) || (bVar2 = ON_BinaryArchive::WriteDouble(file,(double)fVar5), !bVar2)) {
    bVar2 = false;
  }
  else {
    bVar2 = ON_BinaryArchive::WriteChar(file,this->m_b_V5_EnableAnnotationScaling);
  }
  fVar5 = Default3dmAnnotationSettingsPrivate.m_world_view_hatch_scale;
  if ((this != &Default) && (this->m_private != (ON_3dmAnnotationSettingsPrivate *)0x0)) {
    fVar5 = this->m_private->m_world_view_hatch_scale;
  }
  if ((bVar2 != false) && (bVar2 = ON_BinaryArchive::WriteDouble(file,(double)fVar5), bVar2)) {
    bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bEnableHatchScaling);
    if (iVar3 < 0x3c || !bVar2) {
      return bVar2 && iVar3 < 0x3c;
    }
    bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bEnableModelSpaceAnnotationScaling);
    if ((bVar2) &&
       (bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bEnableLayoutSpaceAnnotationScaling), bVar2
       )) {
      if (this == &Default) {
        bVar2 = ON_BinaryArchive::WriteBool
                          (file,Default3dmAnnotationSettingsPrivate.m_use_dimension_layer);
        if (bVar2) {
          local_38.Data1 = Default3dmAnnotationSettingsPrivate.m_dimension_layer_id.Data1;
          local_38._4_4_ = Default3dmAnnotationSettingsPrivate.m_dimension_layer_id._4_4_;
          local_38.Data4._0_4_ =
               Default3dmAnnotationSettingsPrivate.m_dimension_layer_id.Data4._0_4_;
          local_38.Data4._4_4_ =
               Default3dmAnnotationSettingsPrivate.m_dimension_layer_id.Data4._4_4_;
          goto LAB_00375e39;
        }
      }
      else {
        bVar2 = Default3dmAnnotationSettingsPrivate.m_use_dimension_layer;
        if (this->m_private != (ON_3dmAnnotationSettingsPrivate *)0x0) {
          bVar2 = this->m_private->m_use_dimension_layer;
        }
        bVar2 = ON_BinaryArchive::WriteBool(file,bVar2);
        if (bVar2) {
          local_38.Data1 = Default3dmAnnotationSettingsPrivate.m_dimension_layer_id.Data1;
          local_38._4_4_ = Default3dmAnnotationSettingsPrivate.m_dimension_layer_id._4_4_;
          local_38.Data4._0_4_ =
               Default3dmAnnotationSettingsPrivate.m_dimension_layer_id.Data4._0_4_;
          local_38.Data4._4_4_ =
               Default3dmAnnotationSettingsPrivate.m_dimension_layer_id.Data4._4_4_;
          if ((this != &Default) &&
             (pOVar1 = this->m_private, pOVar1 != (ON_3dmAnnotationSettingsPrivate *)0x0)) {
            local_38.Data1 = (pOVar1->m_dimension_layer_id).Data1;
            local_38.Data2 = (pOVar1->m_dimension_layer_id).Data2;
            local_38.Data3 = (pOVar1->m_dimension_layer_id).Data3;
            local_38.Data4._0_4_ = *(undefined4 *)(pOVar1->m_dimension_layer_id).Data4;
            local_38.Data4._4_4_ = *(undefined4 *)((pOVar1->m_dimension_layer_id).Data4 + 4);
          }
LAB_00375e39:
          bVar2 = ON_BinaryArchive::WriteUuid(file,&local_38);
          return bVar2;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_3dmAnnotationSettings::Write( ON_BinaryArchive& file ) const
{
  int minor_version
    = file.Archive3dmVersion() >= 60
    ? 4
    : 2;

  unsigned int i;
  bool rc = file.Write3dmChunkVersion(1, minor_version);
  // March 22, 2010 - Global DimScale abandoned and moved into DimStyles, so now
  // in older files, the dimscale values are multiplied into the DimStyle lengths and
  // DimScale is written as 1.0

  // March 2017 Add
  /*
    unsigned char m_b_V5_EnableAnnotationScaling = 1;

  // [Lowell 3-28-2013] New fields for V6
  unsigned char m_bEnableModelSpaceAnnotationScaling = 1;
  unsigned char m_bEnableLayoutSpaceAnnotationScaling = 1;
  */
  if (rc) rc = file.WriteDouble(1.0);

  if (rc) rc = file.WriteDouble(m_textheight);
  if (rc) rc = file.WriteDouble(m_dimexe);
  if (rc) rc = file.WriteDouble(m_dimexo);
  if (rc) rc = file.WriteDouble(m_arrowlength);
  if (rc) rc = file.WriteDouble(m_arrowwidth);
  if (rc) rc = file.WriteDouble(m_centermark);

  i = static_cast<unsigned int>(m_dimunits);
  if (rc) rc = file.WriteInt( i );
  if (rc) rc = file.WriteInt( m_arrowtype );
  if (rc) rc = file.WriteInt( m_angularunits );
  if (rc) rc = file.WriteInt( m_lengthformat );
  if (rc) rc = file.WriteInt( m_angleformat );

  const unsigned int textalign 
    = (file.Archive3dmVersion() <= 2)
    ? 0
    : 2;
  if (rc) rc = file.WriteInt( textalign );

  if (rc) rc = file.WriteInt( m_resolution );

  if (rc) rc = file.WriteString( m_facename );

  // Added 25 August 2010 chunk version 1.1
  double d = WorldViewTextScale();
  if (rc) rc = file.WriteDouble(d);
  if (rc) rc = file.WriteChar(m_b_V5_EnableAnnotationScaling);

  // Added 14 January 2011 chunk version 1.2
  d = WorldViewHatchScale();
  if (rc) rc = file.WriteDouble(d);
  if (rc) rc = file.WriteChar(m_bEnableHatchScaling);

  // Added 28 March 2013 chunk version 1.3
  if (minor_version >= 3)
  {
    // [Lowell 3-28-2013] New fields for V6
    if (rc) rc = file.WriteChar(m_bEnableModelSpaceAnnotationScaling);
    if (rc) rc = file.WriteChar(m_bEnableLayoutSpaceAnnotationScaling);
  }

  //  Added 17 April 2023 chunk version 1.4
  if (minor_version >= 4)
  {
    if (rc) rc = file.WriteBool(UseDimensionLayer());
    if (rc) rc = file.WriteUuid(DimensionLayerId());
  }

  return rc;
}